

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O3

void __thiscall
libtorrent::heterogeneous_queue<libtorrent::alert>::grow_capacity
          (heterogeneous_queue<libtorrent::alert> *this,int size)

{
  ushort uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ushort uVar5;
  _Head_base<0UL,_char_*,_false> _Var6;
  int iVar7;
  long lVar8;
  _Head_base<0UL,_char_*,_false> __ptr;
  ushort *puVar9;
  int iVar10;
  _Head_base<0UL,_char_*,_false> _Var11;
  
  iVar10 = this->m_capacity;
  iVar7 = 0x80;
  if (0x55 < iVar10) {
    iVar7 = (iVar10 * 3) / 2;
  }
  if (iVar7 <= size) {
    iVar7 = size;
  }
  iVar10 = iVar10 + iVar7;
  _Var6._M_head_impl = (char *)malloc((long)iVar10);
  if (_Var6._M_head_impl == (char *)0x0) {
    aux::throw_ex<std::bad_alloc>();
  }
  __ptr._M_head_impl =
       (this->m_storage)._M_t.super___uniq_ptr_impl<char,_libtorrent::aux::free_deleter>._M_t.
       super__Tuple_impl<0UL,_char_*,_libtorrent::aux::free_deleter>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  if (0 < (long)this->m_size) {
    puVar9 = (ushort *)(__ptr._M_head_impl + this->m_size);
    _Var11._M_head_impl = _Var6._M_head_impl;
    do {
      uVar2 = *(undefined4 *)((long)__ptr._M_head_impl + 4);
      uVar3 = *(undefined4 *)((long)__ptr._M_head_impl + 8);
      uVar4 = *(undefined4 *)((long)__ptr._M_head_impl + 0xc);
      *(undefined4 *)_Var11._M_head_impl = *(undefined4 *)__ptr._M_head_impl;
      *(undefined4 *)(_Var11._M_head_impl + 4) = uVar2;
      *(undefined4 *)(_Var11._M_head_impl + 8) = uVar3;
      *(undefined4 *)(_Var11._M_head_impl + 0xc) = uVar4;
      uVar5 = *(ushort *)((long)__ptr._M_head_impl + 2);
      lVar8 = (long)__ptr._M_head_impl + (ulong)(byte)uVar5 + 0x10;
      uVar1 = *(ushort *)__ptr._M_head_impl;
      (**(code **)((long)__ptr._M_head_impl + 8))
                (_Var11._M_head_impl + (ulong)(byte)uVar5 + 0x10,lVar8);
      __ptr._M_head_impl = (char *)(lVar8 + (ulong)uVar1);
      _Var11._M_head_impl = _Var11._M_head_impl + (ulong)(byte)uVar5 + 0x10 + uVar1;
    } while (__ptr._M_head_impl < puVar9);
    __ptr._M_head_impl =
         (this->m_storage)._M_t.super___uniq_ptr_impl<char,_libtorrent::aux::free_deleter>._M_t.
         super__Tuple_impl<0UL,_char_*,_libtorrent::aux::free_deleter>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    iVar10 = iVar7 + this->m_capacity;
  }
  (this->m_storage)._M_t.super___uniq_ptr_impl<char,_libtorrent::aux::free_deleter>._M_t.
  super__Tuple_impl<0UL,_char_*,_libtorrent::aux::free_deleter>.super__Head_base<0UL,_char_*,_false>
  ._M_head_impl = _Var6._M_head_impl;
  this->m_capacity = iVar10;
  if ((ushort *)__ptr._M_head_impl != (ushort *)0x0) {
    free(__ptr._M_head_impl);
    return;
  }
  return;
}

Assistant:

void grow_capacity(int const size)
		{
			int const amount_to_grow = (std::max)(size
				, (std::max)(m_capacity * 3 / 2, 128));

			// we use malloc() to guarantee alignment
			std::unique_ptr<char, aux::free_deleter> new_storage(
				static_cast<char*>(std::malloc(std::size_t(m_capacity + amount_to_grow)))
				, aux::free_deleter());

			if (!new_storage)
				aux::throw_ex<std::bad_alloc>();

			char* src = m_storage.get();
			char* dst = new_storage.get();
			char const* const end = m_storage.get() + m_size;
			while (src < end)
			{
				header_t* src_hdr = reinterpret_cast<header_t*>(src);
				new (dst) header_t(*src_hdr);
				src += sizeof(header_t) + src_hdr->pad_bytes;
				dst += sizeof(header_t) + src_hdr->pad_bytes;
				int const len = src_hdr->len;
				TORRENT_ASSERT(src + len <= end);
				// this is no-throw
				src_hdr->move(dst, src);
				src_hdr->~header_t();
				src += len;
				dst += len;
			}

			m_storage.swap(new_storage);
			m_capacity += amount_to_grow;

#ifdef TORRENT_ADDRESS_SANITIZER
			__sanitizer_annotate_contiguous_container(
				m_storage.get()
				, m_storage.get() + m_capacity
				, m_storage.get()
				, m_storage.get() + m_size);
#endif
		}